

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcut.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_c010::BinaryCut<unsigned_char>::Run
          (BinaryCut<unsigned_char> *this,istream *input_stream)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48,(long)this->block_length_,&local_49);
  if (0 < this->start_number_) {
    iVar3 = 0;
    do {
      bVar1 = sptk::ReadStream<unsigned_char>
                        (false,0,0,this->block_length_,&local_48,input_stream,(int *)0x0);
      if (!bVar1) goto LAB_00105531;
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->start_number_);
  }
  bVar1 = true;
  if (this->end_number_ == -1 || this->start_number_ <= this->end_number_) {
    iVar3 = this->start_number_;
    do {
      bVar2 = sptk::ReadStream<unsigned_char>
                        (false,0,0,this->block_length_,&local_48,input_stream,(int *)0x0);
      if (!bVar2) break;
      bVar2 = sptk::WriteStream<unsigned_char>
                        (0,this->block_length_,&local_48,(ostream *)&std::cout,(int *)0x0);
      if (!bVar2) goto LAB_00105531;
      bVar2 = iVar3 < this->end_number_;
      iVar3 = iVar3 + 1;
    } while (this->end_number_ == -1 || bVar2);
  }
LAB_00105533:
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
LAB_00105531:
  bVar1 = false;
  goto LAB_00105533;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    std::vector<T> data(block_length_);

    // Skip data.
    for (int block_index(0); block_index < start_number_; ++block_index) {
      if (!sptk::ReadStream(false, 0, 0, block_length_, &data, input_stream,
                            NULL)) {
        return false;
      }
    }

    // Write data.
    for (int block_index(start_number_);
         ((kMagicNumberForEndOfFile == end_number_ ||
           block_index <= end_number_) &&
          sptk::ReadStream(false, 0, 0, block_length_, &data, input_stream,
                           NULL));
         ++block_index) {
      if (!sptk::WriteStream(0, block_length_, data, &std::cout, NULL)) {
        return false;
      }
    }

    return true;
  }